

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O1

void elf32_section(GlobalVars *gv,Elf32_Ehdr *ehdr,ObjectUnit *ou,Elf32_Shdr *shdr,int shndx,
                  char *shstrtab)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t shtype;
  uint32_t uVar4;
  uint32_t x;
  int iVar5;
  Section *pSVar6;
  uint be;
  
  be = (uint)(ehdr->e_ident[5] == '\x02');
  uVar1 = read32(be,shdr);
  uVar2 = read32(be,shdr->sh_offset);
  uVar3 = read32(be,shdr->sh_size);
  shtype = read32(be,shdr->sh_type);
  uVar4 = read32(be,shdr->sh_flags);
  x = read32(be,shdr->sh_addralign);
  iVar5 = shiftcnt(x);
  pSVar6 = elf_add_section(gv,ou,shstrtab + uVar1,ehdr->e_ident + uVar2,(ulong)uVar3,shtype,
                           (ulong)uVar4,(uint8_t)iVar5);
  if (pSVar6 != (Section *)0x0) {
    uVar1 = read32(be,shdr->sh_link);
    pSVar6->link = uVar1;
    pSVar6->id = shndx;
  }
  return;
}

Assistant:

static void elf32_section(struct GlobalVars *gv,struct Elf32_Ehdr *ehdr,
                          struct ObjectUnit *ou,struct Elf32_Shdr *shdr,
                          int shndx,char *shstrtab)
/* create a new section */
{
  bool be = (ehdr->e_ident[EI_DATA] == ELFDATA2MSB);
  struct Section *s;

  if (s = elf_add_section(gv,ou,
                          shstrtab+read32(be,shdr->sh_name),
                          (uint8_t *)ehdr+read32(be,shdr->sh_offset),
                          read32(be,shdr->sh_size),
                          read32(be,shdr->sh_type),
                          read32(be,shdr->sh_flags),
                          shiftcnt(read32(be,shdr->sh_addralign)))) {
    s->link = read32(be,shdr->sh_link);  /* save link for later use */
    s->id = shndx;  /* use section header index for identification */
  }
}